

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

void __thiscall ObjLoader::ObjLoader(ObjLoader *this,string *filename)

{
  bool bVar1;
  allocator<char> local_b9;
  string local_b8;
  Image<unsigned_char> local_98;
  Image<unsigned_char> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string absolutepath;
  string *filename_local;
  ObjLoader *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&this->m_vertexPositions);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::vector(&this->m_vertexColors);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&this->m_vertexUVs);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&this->m_vertexNormals);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&this->m_vertexTangents);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->m_ibos);
  NamedTextureImages::NamedTextureImages(&this->m_images);
  std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::vector(&this->m_materials);
  absolutename((string *)local_48,filename);
  basename((char *)&local_68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_rootDir,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  Image<unsigned_char>::Image(&local_80,white,1,1,4);
  NamedTextureImages::add(&this->m_images,&defaultDiffuseName_abi_cxx11_,&local_80);
  Image<unsigned_char>::Image(&local_98,bluish,1,1,4);
  NamedTextureImages::add(&this->m_images,&defaultNormalName_abi_cxx11_,&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,".glitter",&local_b9);
  bVar1 = endsWith((string *)local_48,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  if (bVar1) {
    loadBinaryFile(this,(string *)local_48);
  }
  else {
    parseFile(this,(string *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

ObjLoader::ObjLoader(const std::string & filename)
{
  std::string absolutepath = absolutename(filename);
  m_rootDir = basename(absolutepath);
  m_images.add(defaultDiffuseName, Image<>(white, 1, 1, 4));
  m_images.add(defaultNormalName, Image<>(bluish, 1, 1, 4));
  if (endsWith(absolutepath, ".glitter")) {
    loadBinaryFile(absolutepath);
  } else {
    parseFile(absolutepath);
  }
}